

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O1

ssize_t __thiscall
sc_core::vcd_signed_int_trace::write(vcd_signed_int_trace *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  uint uVar5;
  undefined4 in_register_00000034;
  ulong __n_00;
  char rawdata [1000];
  char compdata [1000];
  byte local_7f8 [1008];
  char local_408 [1008];
  
  puVar3 = (uint *)this->object;
  uVar5 = *puVar3;
  bVar1 = (byte)this->rem_bits;
  uVar2 = (this->super_vcd_trace).bit_width;
  __n_00 = (ulong)uVar2;
  if ((int)(uVar5 << (bVar1 & 0x1f)) >> (bVar1 & 0x1f) == uVar5) {
    if (0 < (int)uVar2) {
      uVar5 = 1 << ((char)uVar2 - 1U & 0x1f);
      uVar4 = 0;
      do {
        local_7f8[uVar4] = (*puVar3 & uVar5) == 0 ^ 0x31;
        uVar5 = uVar5 >> 1;
        uVar4 = uVar4 + 1;
      } while (__n_00 != uVar4);
      __n_00 = uVar4 & 0xffffffff;
      goto LAB_0020b963;
    }
  }
  else if (0 < (int)uVar2) {
    memset(local_7f8,0x78,__n_00);
    goto LAB_0020b963;
  }
  __n_00 = 0;
LAB_0020b963:
  local_7f8[__n_00] = 0;
  vcd_trace::compose_data_line(&this->super_vcd_trace,(char *)local_7f8,local_408);
  fputs(local_408,(FILE *)CONCAT44(in_register_00000034,__fd));
  uVar5 = *this->object;
  this->old_value = uVar5;
  return (ulong)uVar5;
}

Assistant:

void vcd_signed_int_trace::write(FILE* f)
{
    char rawdata[1000];
    char compdata[1000];
    int bitindex;

    // Check for overflow
    if (((object << rem_bits) >> rem_bits) != object) {
        for (bitindex = 0; bitindex < bit_width; bitindex++) {
            rawdata[bitindex] = 'x';
        }
    }
    else {
        unsigned bit_mask = 1 << (bit_width-1);
        for (bitindex = 0; bitindex < bit_width; bitindex++) {
            rawdata[bitindex] = (object & bit_mask)? '1' : '0';
            bit_mask = bit_mask >> 1;
        }
    }
    rawdata[bitindex] = '\0';
    compose_data_line(rawdata, compdata);
    std::fputs(compdata, f);
    old_value = object;
}